

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

string * __thiscall
args::NamedBase::GetDefaultString_abi_cxx11_
          (string *__return_storage_ptr__,NamedBase *this,HelpParams *param_1)

{
  HelpParams *param_1_local;
  NamedBase *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetDefaultString(const HelpParams&) const { return {}; }